

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void __thiscall NULLCIO::WriteToConsoleExact(NULLCIO *this,NULLCArray data)

{
  if (this == (NULLCIO *)0x0) {
    nullcThrowError("ERROR: argument should not be a nullptr",data.ptr,
                    CONCAT44((int)((ulong)register0x00000010 >> 0x20),data.len));
    return;
  }
  if (writeFunc != (code *)0x0) {
    (*writeFunc)(contextFunc,this,(ulong)data.ptr & 0xffffffff);
    return;
  }
  return;
}

Assistant:

void WriteToConsoleExact(NULLCArray data)
	{
		if(!data.ptr)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return;
		}

		if(!writeFunc)
			return;

		writeFunc(contextFunc, data.ptr, data.len);
	}